

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::splitBuffer
          (AtomicCounterTest *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *increments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *preGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *postGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *gets)

{
  int iVar1;
  const_reference pvVar2;
  int local_5c;
  int id;
  int counterNdx;
  int callNdx;
  int threadNdx;
  int firstDec;
  int firstInc;
  int firstGet;
  int firstPostGet;
  int firstPreGet;
  int bufferValueCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *postGets_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *preGets_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *increments_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer_local;
  AtomicCounterTest *this_local;
  
  iVar1 = (this->m_spec).callCount * (this->m_spec).threadCount * (this->m_spec).atomicCounterCount;
  firstGet = -1;
  firstInc = -1;
  firstDec = -1;
  threadNdx = -1;
  callNdx = -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(increments);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(decrements);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(preGets);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(postGets);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(gets);
  if ((this->m_spec).operations == OPERATION_GET) {
    firstDec = 0;
  }
  else if ((this->m_spec).operations == OPERATION_INC) {
    threadNdx = 0;
  }
  else if ((this->m_spec).operations == OPERATION_DEC) {
    callNdx = 0;
  }
  else if ((this->m_spec).operations == (OPERATION_GET|OPERATION_INC)) {
    firstGet = 0;
    firstInc = iVar1 * 2;
    threadNdx = iVar1;
  }
  else if ((this->m_spec).operations == (OPERATION_GET|OPERATION_DEC)) {
    firstGet = 0;
    firstInc = iVar1 * 2;
    callNdx = iVar1;
  }
  else if ((this->m_spec).operations == (OPERATION_GET|OPERATION_DEC|OPERATION_INC)) {
    firstGet = 0;
    firstInc = iVar1 * 3;
    callNdx = iVar1 * 2;
    threadNdx = iVar1;
  }
  else if ((this->m_spec).operations == (OPERATION_DEC|OPERATION_INC)) {
    threadNdx = 0;
    callNdx = iVar1;
  }
  for (counterNdx = 0; counterNdx < (this->m_spec).threadCount; counterNdx = counterNdx + 1) {
    for (id = 0; id < (this->m_spec).callCount; id = id + 1) {
      for (local_5c = 0; local_5c < (this->m_spec).atomicCounterCount; local_5c = local_5c + 1) {
        iVar1 = (counterNdx * (this->m_spec).callCount + id) * (this->m_spec).atomicCounterCount +
                local_5c;
        if (threadNdx != -1) {
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (buffer,(long)(threadNdx + iVar1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(increments,pvVar2);
        }
        if (callNdx != -1) {
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (buffer,(long)(callNdx + iVar1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(decrements,pvVar2);
        }
        if (firstGet != -1) {
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (buffer,(long)(firstGet + iVar1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(preGets,pvVar2);
        }
        if (firstInc != -1) {
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (buffer,(long)(firstInc + iVar1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(postGets,pvVar2);
        }
        if (firstDec != -1) {
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (buffer,(long)(firstDec + iVar1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(gets,pvVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void AtomicCounterTest::splitBuffer (const vector<deUint32>& buffer, vector<deUint32>& increments, vector<deUint32>& decrements, vector<deUint32>& preGets, vector<deUint32>& postGets, vector<deUint32>& gets) const
{
	const int bufferValueCount	= m_spec.callCount * m_spec.threadCount * m_spec.atomicCounterCount;

	int firstPreGet				= -1;
	int firstPostGet			= -1;
	int	firstGet				= -1;
	int firstInc				= -1;
	int firstDec				= -1;

	increments.clear();
	decrements.clear();
	preGets.clear();
	postGets.clear();
	gets.clear();

	if (m_spec.operations == OPERATION_GET)
		firstGet = 0;
	else if (m_spec.operations == OPERATION_INC)
		firstInc = 0;
	else if (m_spec.operations == OPERATION_DEC)
		firstDec = 0;
	else if (m_spec.operations == (OPERATION_GET|OPERATION_INC))
	{
		firstPreGet		= 0;
		firstInc		= bufferValueCount;
		firstPostGet	= bufferValueCount * 2;
	}
	else if (m_spec.operations == (OPERATION_GET|OPERATION_DEC))
	{
		firstPreGet		= 0;
		firstDec		= bufferValueCount;
		firstPostGet	= bufferValueCount * 2;
	}
	else if (m_spec.operations == (OPERATION_GET|OPERATION_DEC|OPERATION_INC))
	{
		firstPreGet		= 0;
		firstInc		= bufferValueCount;
		firstDec		= bufferValueCount * 2;
		firstPostGet	= bufferValueCount * 3;
	}
	else if (m_spec.operations == (OPERATION_DEC|OPERATION_INC))
	{
		firstInc		= 0;
		firstDec		= bufferValueCount;
	}
	else
		DE_ASSERT(false);

	for (int threadNdx = 0; threadNdx < m_spec.threadCount; threadNdx++)
	{
		for (int callNdx = 0; callNdx < m_spec.callCount; callNdx++)
		{
			for (int counterNdx = 0; counterNdx < m_spec.atomicCounterCount; counterNdx++)
			{
				const int id = ((threadNdx * m_spec.callCount) + callNdx) * m_spec.atomicCounterCount + counterNdx;

				if (firstInc != -1)
					increments.push_back(buffer[firstInc + id]);

				if (firstDec != -1)
					decrements.push_back(buffer[firstDec + id]);

				if (firstPreGet != -1)
					preGets.push_back(buffer[firstPreGet + id]);

				if (firstPostGet != -1)
					postGets.push_back(buffer[firstPostGet + id]);

				if (firstGet != -1)
					gets.push_back(buffer[firstGet + id]);
			}
		}
	}
}